

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

int main(int argc,char **argv)

{
  TidyDoc __s1;
  FILE *pFVar1;
  Bool BVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  TidyOptionId TVar6;
  TidyConfigCategory TVar7;
  int iVar8;
  int iVar9;
  TidyDoc tdoc;
  ctmbstr ptVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ctmbstr ptVar14;
  size_t sVar15;
  char *pcVar16;
  char *s;
  TidyIterator p_Var17;
  tmbstr ptVar18;
  TidyOption p_Var19;
  ctmbstr ptVar20;
  char **ppcVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  char *pcVar25;
  code *OptionPrint;
  FILE *__stream;
  TidyDoc tdoc_00;
  char *pcVar26;
  char cVar27;
  CmdOptDesc *pCVar28;
  char *pc2;
  int iVar29;
  bool bVar30;
  char **local_a8;
  ctmbstr local_a0;
  int local_98;
  char local_91;
  ctmbstr name;
  uint acclvl;
  char *pcStack_70;
  undefined8 local_68;
  ctmbstr ptStack_60;
  char *local_58;
  char *pcStack_50;
  ulong local_48;
  uint local_3c;
  ctmbstr local_38;
  
  pcVar26 = *argv;
  tdoc = tidyCreate();
  tidySetMessageCallback(tdoc,reportCallback);
  errout = _stderr;
  BVar2 = tidyFileExists(tdoc,"/etc/tidy.conf");
  if ((BVar2 != no) && (uVar3 = tidyLoadConfig(tdoc,"/etc/tidy.conf"), pFVar1 = errout, uVar3 != 0))
  {
    ptVar10 = tidyLocalizedString(0x310);
    fprintf((FILE *)pFVar1,ptVar10,"/etc/tidy.conf",(ulong)uVar3);
    fputc(10,(FILE *)errout);
  }
  pcVar11 = getenv("HTML_TIDY");
  if (pcVar11 == (char *)0x0) {
    BVar2 = tidyFileExists(tdoc,"~/.tidyrc");
    if ((BVar2 == no) ||
       (uVar3 = tidyLoadConfig(tdoc,"~/.tidyrc"), __stream = (FILE *)errout, uVar3 == 0))
    goto LAB_0013062c;
    ptVar10 = tidyLocalizedString(0x310);
    pcVar11 = "~/.tidyrc";
  }
  else {
    uVar3 = tidyLoadConfig(tdoc,pcVar11);
    __stream = (FILE *)errout;
    if (uVar3 == 0) goto LAB_0013062c;
    ptVar10 = tidyLocalizedString(0x310);
  }
  fprintf(__stream,ptVar10,pcVar11,(ulong)uVar3);
  fputc(10,(FILE *)errout);
LAB_0013062c:
  iVar24 = 0;
  pcVar11 = (ctmbstr)0x0;
  local_a0 = (ctmbstr)0x0;
LAB_0013063a:
  if (argc < 1) {
LAB_00131113:
    if ((iVar24 == 0 && errout == _stderr) && (BVar2 = tidyOptGetBool(tdoc,TidyQuiet), BVar2 == no))
    {
      fputc(10,(FILE *)errout);
    }
    if (iVar24 + (int)pcVar11 != 0) {
      tidyErrorSummary(tdoc);
    }
    tidyGeneralInfo(tdoc);
    tidyRelease(tdoc);
    if (iVar24 != 0) {
      return 2;
    }
    return (uint)((int)pcVar11 != 0);
  }
  do {
    ppcVar21 = argv + 1;
    if ((uint)argc < 2) {
      iVar4 = tidyParseStdin(tdoc);
      pcVar12 = "stdin";
    }
    else {
      pcVar12 = *ppcVar21;
      if (*pcVar12 == '-') break;
      BVar2 = tidyOptGetBool(tdoc,TidyShowFilename);
      if (BVar2 != no) {
        fprintf((FILE *)errout,"Tidy: \'%s\'",pcVar12);
        fputc(10,(FILE *)errout);
      }
      BVar2 = tidyOptGetBool(tdoc,TidyEmacs);
      if ((BVar2 != no) || (BVar2 = tidyOptGetBool(tdoc,TidyShowFilename), BVar2 != no)) {
        tidySetEmacsFile(tdoc,pcVar12);
      }
      iVar4 = tidyParseFile(tdoc,pcVar12);
    }
    if ((-1 < iVar4) && (iVar4 = tidyCleanAndRepair(tdoc), -1 < iVar4)) {
      iVar4 = tidyRunDiagnostics(tdoc);
      if (iVar4 < 2) {
        if (-1 < iVar4) goto LAB_00130707;
      }
      else {
        BVar2 = tidyOptGetBool(tdoc,TidyForceOutput);
        if (BVar2 != no) {
LAB_00130707:
          BVar2 = tidyOptGetBool(tdoc,TidyShowMarkup);
          if (BVar2 != no) {
            BVar2 = tidyOptGetBool(tdoc,TidyWriteBack);
            if ((((uint)argc < 2) || (BVar2 == no)) &&
               (pcVar12 = tidyOptGetValue(tdoc,TidyOutFile), pcVar12 == (ctmbstr)0x0)) {
              tidySaveStdout(tdoc);
            }
            else {
              tidySaveFile(tdoc,pcVar12);
            }
          }
        }
      }
    }
    uVar5 = tidyErrorCount(tdoc);
    iVar24 = iVar24 + uVar5;
    uVar5 = tidyWarningCount(tdoc);
    pcVar11 = (char *)(ulong)((int)pcVar11 + uVar5);
    tidyAccessWarningCount(tdoc);
    bVar30 = (uint)argc < 3;
    argc = argc - 1;
    argv = ppcVar21;
    if (bVar30) goto LAB_00131113;
  } while( true );
  pcVar16 = pcVar12 + 1;
  iVar4 = strcasecmp(pcVar16,"xml");
  local_a8 = argv;
  uVar3 = argc;
  if (iVar4 == 0) {
    TVar6 = TidyXmlTags;
LAB_00130da4:
    BVar2 = yes;
  }
  else {
    iVar4 = strcasecmp(pcVar16,"asxml");
    if ((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"asxhtml"), iVar4 == 0)) {
      TVar6 = TidyXhtmlOut;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"ashtml");
    if (iVar4 == 0) {
      TVar6 = TidyHtmlOut;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"indent");
    if (iVar4 == 0) {
      tidyOptSetInt(tdoc,TidyIndentContent,2);
      uVar13 = tidyOptGetInt(tdoc,TidyIndentSpaces);
      if (uVar13 == 0) {
        tidyOptResetToDefault(tdoc,TidyIndentSpaces);
      }
      goto LAB_00130db0;
    }
    iVar4 = strcasecmp(pcVar16,"omit");
    if (iVar4 == 0) {
      TVar6 = TidyOmitOptionalTags;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"upper");
    if (iVar4 == 0) {
      TVar6 = TidyUpperCaseTags;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"clean");
    if (iVar4 == 0) {
      TVar6 = TidyMakeClean;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"gdoc");
    if (iVar4 == 0) {
      TVar6 = TidyGDocClean;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"bare");
    if (iVar4 == 0) {
      TVar6 = TidyMakeBare;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"raw");
    if ((((((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"ascii"), iVar4 == 0)) ||
          (iVar4 = strcasecmp(pcVar16,"latin0"), iVar4 == 0)) ||
         (((iVar4 = strcasecmp(pcVar16,"latin1"), iVar4 == 0 ||
           (iVar4 = strcasecmp(pcVar16,"utf8"), iVar4 == 0)) ||
          ((iVar4 = strcasecmp(pcVar16,"iso2022"), iVar4 == 0 ||
           ((iVar4 = strcasecmp(pcVar16,"utf16le"), iVar4 == 0 ||
            (iVar4 = strcasecmp(pcVar16,"utf16be"), iVar4 == 0)))))))) ||
        (iVar4 = strcasecmp(pcVar16,"utf16"), iVar4 == 0)) ||
       ((((iVar4 = strcasecmp(pcVar16,"shiftjis"), iVar4 == 0 ||
          (iVar4 = strcasecmp(pcVar16,"big5"), iVar4 == 0)) ||
         (iVar4 = strcasecmp(pcVar16,"mac"), iVar4 == 0)) ||
        ((iVar4 = strcasecmp(pcVar16,"win1252"), iVar4 == 0 ||
         (iVar4 = strcasecmp(pcVar16,"ibm858"), iVar4 == 0)))))) {
      tidySetCharEncoding(tdoc,pcVar16);
      goto LAB_00130db0;
    }
    iVar4 = strcasecmp(pcVar16,"numeric");
    if (iVar4 == 0) {
      TVar6 = TidyNumEntities;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"modify");
    if (((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"change"), iVar4 == 0)) ||
       (iVar4 = strcasecmp(pcVar16,"update"), iVar4 == 0)) {
      TVar6 = TidyWriteBack;
      goto LAB_00130da4;
    }
    iVar4 = strcasecmp(pcVar16,"errors");
    if (iVar4 != 0) {
      iVar4 = strcasecmp(pcVar16,"quiet");
      if (iVar4 != 0) {
        iVar4 = strcasecmp(pcVar16,"language");
        if ((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"lang"), iVar4 == 0)) {
          if (argc != 2) {
            __s1 = (TidyDoc)argv[2];
            tdoc_00 = __s1;
            iVar4 = strcasecmp((char *)__s1,"help");
            if (iVar4 == 0) {
              lang_help(tdoc_00);
              exit(0);
            }
            BVar2 = tidySetLanguage((ctmbstr)__s1);
            if (BVar2 == no) {
              ptVar10 = tidyLocalizedString(0x349);
              pcVar12 = argv[2];
              ptVar14 = tidyGetLanguage();
              printf(ptVar10,pcVar12,ptVar14);
              putchar(10);
            }
            goto LAB_00130f78;
          }
          ptVar10 = tidyLocalizedString(0x348);
          puts(ptVar10);
          goto LAB_00130e67;
        }
        iVar4 = strcasecmp(pcVar16,"help");
        if ((((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"-help"), iVar4 == 0)) ||
            (iVar4 = strcasecmp(pcVar16,"h"), iVar4 == 0)) || (cVar27 = *pcVar16, cVar27 == '?')) {
          ptVar10 = tidyLocalizedString(0x353);
          sVar15 = strlen(pcVar26);
          name = pcVar26;
          while( true ) {
            pcVar11 = pcVar26 + 1;
            bVar30 = sVar15 == 0;
            sVar15 = sVar15 - 1;
            if (bVar30) break;
            cVar27 = *pcVar26;
            pcVar26 = pcVar11;
            if (((cVar27 == '\\') || (cVar27 == '/')) && (*pcVar11 != '\0')) {
              name = pcVar11;
            }
          }
          ptVar14 = tidyLibraryVersion();
          printf(ptVar10,name,ptVar14);
          putchar(10);
          ptVar10 = tidyPlatform();
          if (ptVar10 == (ctmbstr)0x0) {
            ptVar10 = tidyLocalizedString(0x355);
            pcVar26 = stringWithFormat(ptVar10);
          }
          else {
            ptVar10 = tidyLocalizedString(0x354);
            ptVar14 = tidyPlatform();
            pcVar26 = stringWithFormat(ptVar10,ptVar14);
          }
          sVar15 = strlen(pcVar26);
          if (0x4d < sVar15) {
            sVar15 = 0x4e;
          }
          puts(pcVar26);
          printf("%*.*s\n\n",sVar15 & 0xffffffff,sVar15 & 0xffffffff,
                 "=================================================================");
          free(pcVar26);
          for (local_a8 = (char **)0x0; local_a8 != (char **)0x5;
              local_a8 = (char **)((long)local_a8 + 1)) {
            ptVar10 = tidyLocalizedString(cmdopt_catname[(long)local_a8].key);
            sVar15 = strlen(ptVar10);
            if (0x4d < sVar15) {
              sVar15 = 0x4e;
            }
            puts(ptVar10);
            printf("%*.*s\n",sVar15 & 0xffffffff,sVar15 & 0xffffffff,
                   "-----------------------------------------------------------------");
            for (name = ""; *(long *)(name + 8) != 0; name = name + 0x30) {
              if (local_a8 == (char **)(ulong)*(uint *)name) {
                _acclvl = *(TidyIterator *)name;
                pcStack_70 = *(char **)(name + 8);
                local_68 = *(undefined8 *)(name + 0x10);
                ptStack_60 = *(ctmbstr *)(name + 0x18);
                local_58 = *(char **)(name + 0x20);
                pcStack_50 = *(char **)(name + 0x28);
                localize_option_names((CmdOptDesc *)&acclvl);
                pcVar26 = pcStack_70;
                sVar15 = strlen(pcStack_70);
                pcVar12 = local_58;
                iVar24 = (int)sVar15;
                if (local_58 != (char *)0x0) {
                  sVar15 = strlen(local_58);
                  iVar24 = iVar24 + (int)sVar15 + 2;
                }
                pcVar11 = pcStack_50;
                if (pcStack_50 != (char *)0x0) {
                  sVar15 = strlen(pcStack_50);
                  iVar24 = iVar24 + (int)sVar15 + 2;
                }
                pcVar16 = (char *)malloc((ulong)(iVar24 + 1));
                if (pcVar16 == (char *)0x0) goto LAB_00131f1e;
                strcpy(pcVar16,pcVar26);
                free(pcVar26);
                if (pcVar12 != (char *)0x0) {
                  sVar15 = strlen(pcVar16);
                  (pcVar16 + sVar15)[0] = ',';
                  (pcVar16 + sVar15)[1] = ' ';
                  pcVar16[sVar15 + 2] = '\0';
                  strcat(pcVar16,pcVar12);
                  free(pcVar12);
                }
                if (pcVar11 != (char *)0x0) {
                  sVar15 = strlen(pcVar16);
                  (pcVar16 + sVar15)[0] = ',';
                  (pcVar16 + sVar15)[1] = ' ';
                  pcVar16[sVar15 + 2] = '\0';
                  strcat(pcVar16,pcVar11);
                  free(pcVar11);
                }
                pcVar11 = tidyLocalizedString(*(uint *)(name + 0x10));
                pcVar26 = (char *)malloc(0x1b);
                pcVar12 = (char *)malloc(0x33);
                if (pcVar26 == (char *)0x0) goto LAB_00131f1e;
                s = pcVar16;
                if (pcVar12 == (char *)0x0) goto LAB_00131f1e;
                do {
                  s = cutToWhiteSpace(s,0x1a,pcVar26);
                  pcVar11 = cutToWhiteSpace(pcVar11,0x32,pcVar12);
                  pcVar22 = pcVar26;
                  if (*pcVar26 == '\0') {
                    pcVar22 = "";
                  }
                  pcVar25 = pcVar12;
                  if (*pcVar12 == '\0') {
                    pcVar25 = "";
                  }
                  printf(" %-*.*s %-*.*s\n",0x1a,0x1a,pcVar22,0x32,0x32,pcVar25);
                } while (s != (char *)0x0 || pcVar11 != (char *)0x0);
                free(pcVar26);
                free(pcVar12);
                free(pcVar16);
              }
            }
            putchar(10);
          }
          putchar(10);
          ptVar10 = tidyLocalizedString(0x357);
          ptVar18 = stringWithFormat(ptVar10,"/etc/tidy.conf","~/.tidyrc");
          ptVar10 = tidyLocalizedString(0x356);
          printf(ptVar10,ptVar18);
          free(ptVar18);
LAB_00131550:
          putchar(10);
LAB_001319c8:
          tidyRelease(tdoc);
          return 0;
        }
        iVar4 = strcasecmp(pcVar16,"xml-help");
        if (iVar4 == 0) {
          ptVar10 = tidyLibraryVersion();
          printf("<?xml version=\"1.0\"?>\n<cmdline version=\"%s\">\n",ptVar10);
          for (pCVar28 = cmdopt_defs; pCVar28->name1 != (ctmbstr)0x0; pCVar28 = pCVar28 + 1) {
            local_58 = pCVar28->name2;
            pcStack_50 = pCVar28->name3;
            local_68._0_4_ = pCVar28->key;
            local_68._4_4_ = pCVar28->subKey;
            ptStack_60 = pCVar28->eqconfig;
            _acclvl = *(TidyIterator *)pCVar28;
            pcStack_70 = pCVar28->name1;
            localize_option_names((CmdOptDesc *)&acclvl);
            uVar5 = pCVar28->key;
            printf(" <option class=\"%s\">\n",cmdopt_catname[pCVar28->cat].mnemonic);
            pcVar26 = pcStack_70;
            print_xml_help_option_element("name",pcStack_70);
            pcVar11 = local_58;
            print_xml_help_option_element("name",local_58);
            pcVar12 = pcStack_50;
            print_xml_help_option_element("name",pcStack_50);
            ptVar10 = tidyLocalizedString(uVar5);
            print_xml_help_option_element("description",ptVar10);
            ptVar10 = ptStack_60;
            if (pCVar28->eqconfig == (ctmbstr)0x0) {
              puts("  <eqconfig />");
              ptVar10 = ptStack_60;
            }
            else {
              print_xml_help_option_element("eqconfig",ptStack_60);
            }
            puts(" </option>");
            free(pcVar26);
            free(pcVar11);
            free(pcVar12);
            free(ptVar10);
          }
          pcVar26 = "</cmdline>";
        }
        else {
          iVar4 = strcasecmp(pcVar16,"xml-error-strings");
          if (iVar4 == 0) {
            p_Var17 = getErrorCodeList();
            _acclvl = p_Var17;
            puts("<?xml version=\"1.0\"?>");
            ptVar10 = tidyLibraryVersion();
            printf("<error_strings version=\"%s\">\n",ptVar10);
            while (p_Var17 != (TidyIterator)0x0) {
              uVar5 = getNextErrorCode((TidyIterator *)&acclvl);
              ptVar10 = tidyLocalizedString(uVar5);
              puts(" <error_string>");
              ptVar14 = tidyErrorCodeAsKey(uVar5);
              printf("  <name>%s</name>\n",ptVar14);
              ptVar14 = tidyGetLanguage();
              if (ptVar10 == (ctmbstr)0x0) {
                printf("  <string class=\"%s\">NULL</string>\n",ptVar14);
              }
              else {
                printf("  <string class=\"%s\"><![CDATA[%s]]></string>\n",ptVar14,ptVar10);
              }
              puts(" </error_string>");
              p_Var17 = _acclvl;
            }
            pcVar26 = "</error_strings>";
          }
          else {
            iVar4 = strcasecmp(pcVar16,"xml-options-strings");
            if (iVar4 == 0) {
              ptVar10 = tidyLibraryVersion();
              printf("<?xml version=\"1.0\"?>\n<options_strings version=\"%s\">\n",ptVar10);
              ForEachOption(tdoc,printXMLOptionString);
              pcVar26 = "</options_strings>";
LAB_00131931:
              puts(pcVar26);
              goto LAB_001319c8;
            }
            iVar4 = strcasecmp(pcVar16,"xml-strings");
            if (iVar4 != 0) {
              iVar4 = strcasecmp(pcVar16,"help-config");
              if (iVar4 == 0) {
                putchar(10);
                ptVar10 = tidyLocalizedString(0x358);
                printf(anon_var_dwarf_19f52 + 0x16,ptVar10);
                ptVar10 = tidyLocalizedString(0x359);
                ptVar14 = tidyLocalizedString(0x35a);
                ptVar20 = tidyLocalizedString(0x35b);
                printf("%-27.27s %-9.9s  %-40.40s\n",ptVar10,ptVar14,ptVar20);
                printf("%-27.27s %-9.9s  %-40.40s\n",
                       "=================================================================",
                       "=================================================================");
                OptionPrint = printOption;
LAB_001319c0:
                ForEachSortedOption(tdoc,OptionPrint);
                goto LAB_001319c8;
              }
              iVar4 = strcasecmp(pcVar16,"help-env");
              if (iVar4 == 0) {
                pcVar11 = getenv("HTML_TIDY");
                pcVar26 = pcVar11;
                if (pcVar11 == (char *)0x0) {
                  pcVar26 = tidyLocalizedString(0x35e);
                }
                ptVar10 = tidyLocalizedString(0x35d);
                ptVar18 = stringWithFormat(ptVar10,"/etc/tidy.conf","~/.tidyrc");
                if (pcVar26 == (char *)0x0) {
                  pcVar26 = tidyLocalizedString(0x35e);
                }
                putchar(10);
                ptVar10 = tidyLocalizedString(0x35c);
                printf(ptVar10,ptVar18,pcVar26);
                if (pcVar11 != (char *)0x0) {
                  ptVar10 = tidyLocalizedString(0x35f);
                  printf(ptVar10,"~/.tidyrc");
                }
                free(ptVar18);
                goto LAB_00131550;
              }
              iVar4 = strcasecmp(pcVar16,"help-option");
              if (iVar4 == 0) {
                if (argc == 2) {
                  pcVar26 = tidyLocalizedString(0x34a);
                  goto LAB_00131b30;
                }
                local_38 = argv[2];
                TVar6 = tidyOptGetIdForName(local_38);
                p_Var19 = tidyGetOption(tdoc,TVar6);
                TVar7 = tidyOptGetCategory(p_Var19);
                local_91 = TVar7 == TidyInternalCategory || TidyXmlTags < TVar6;
                if (TVar7 == TidyInternalCategory || TidyXmlTags < TVar6) {
                  local_a8 = (char **)tidyLocalizedString(0x350);
                  goto LAB_00131e56;
                }
                p_Var19 = tidyGetOption(tdoc,TVar6);
                ptVar10 = tidyOptGetDoc(tdoc,p_Var19);
                if (ptVar10 != (ctmbstr)0x0) {
                  cVar27 = *ptVar10;
                  iVar24 = 0;
                  if (cVar27 != '\0') {
                    local_a0 = (char *)0x0;
                    pcVar11 = (char *)0x0;
                    local_98 = 0;
                    iVar4 = 0;
                    iVar29 = 1;
                    local_48 = 0;
                    iVar9 = 0;
                    local_a8 = (char **)0x0;
                    goto LAB_00131c12;
                  }
                }
                local_a8 = (char **)0x0;
LAB_00131e56:
                while( true ) {
                  putchar(10);
                  printf("`--%s`\n\n",local_38);
                  pcVar26 = (char *)malloc(0x4f);
                  ppcVar21 = local_a8;
                  if (pcVar26 != (char *)0x0) break;
LAB_00131f1e:
                  outOfMemory();
switchD_00131c7b_caseD_6:
                  puts("<Error> The localized string probably has bad HTML.");
LAB_00131dfa:
                  free(pcVar11);
                }
                do {
                  ppcVar21 = (char **)cutToWhiteSpace((char *)ppcVar21,0x4e,pcVar26);
                  pcVar11 = pcVar26;
                  if (*pcVar26 == '\0') {
                    pcVar11 = "";
                  }
                  printf("%-78.78s\n",pcVar11);
                } while (ppcVar21 != (char **)0x0);
                free(pcVar26);
                putchar(10);
                if (local_91 == '\0') {
                  free(local_a8);
                }
                goto LAB_00131b35;
              }
              iVar4 = strcasecmp(pcVar16,"xml-config");
              if (iVar4 == 0) {
                ptVar10 = tidyLibraryVersion();
                printf("<?xml version=\"1.0\"?>\n<config version=\"%s\">\n",ptVar10);
                ForEachOption(tdoc,printXMLOption);
                pcVar26 = "</config>";
                goto LAB_00131931;
              }
              iVar4 = strcasecmp(pcVar16,"show-config");
              if (iVar4 == 0) {
                ptVar10 = tidyLocalizedString(0x33f);
                printf("\n%s\n",ptVar10);
                ptVar10 = tidyLocalizedString(0x340);
                ptVar14 = tidyLocalizedString(0x341);
                ptVar20 = tidyLocalizedString(0x342);
                printf("%-27.27s %-9.9s  %-40.40s\n",ptVar10,ptVar14,ptVar20);
                printf("%-27.27s %-9.9s  %-40.40s\n",
                       "=================================================================",
                       "=================================================================");
                OptionPrint = printOptionValues;
                goto LAB_001319c0;
              }
              iVar4 = strcasecmp(pcVar16,"export-config");
              if (iVar4 == 0) {
LAB_001319dd:
                ForEachSortedOption(tdoc,printOptionExportValues);
                goto LAB_00131b35;
              }
              iVar4 = strcasecmp(pcVar16,"export-default-config");
              if (iVar4 == 0) {
                tidyOptResetAllToDefault(tdoc);
                goto LAB_001319dd;
              }
              iVar4 = strcasecmp(pcVar16,"config");
              if (iVar4 == 0) {
                if (argc == 2) goto LAB_00130e67;
                tidyLoadConfig(tdoc,argv[2]);
LAB_00130f0e:
                ptVar10 = tidyOptGetValue(tdoc,TidyErrFile);
                if ((ptVar10 != (ctmbstr)0x0) &&
                   ((local_a0 == (ctmbstr)0x0 || (BVar2 = samefile(local_a0,ptVar10), BVar2 == no)))
                   ) {
                  errout = tidySetErrorFile(tdoc,ptVar10);
                  local_a0 = ptVar10;
                }
              }
              else {
                iVar4 = strcasecmp(pcVar16,"output");
                if (((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"-output-file"), iVar4 == 0)) ||
                   (iVar4 = strcasecmp(pcVar16,"o"), iVar4 == 0)) {
                  if (argc == 2) goto LAB_00130e67;
                  tidyOptSetValue(tdoc,TidyOutFile,argv[2]);
                }
                else {
                  iVar4 = strcasecmp(pcVar16,"file");
                  if (((iVar4 != 0) && (iVar4 = strcasecmp(pcVar16,"-file"), iVar4 != 0)) &&
                     (iVar4 = strcasecmp(pcVar16,"f"), iVar4 != 0)) {
                    iVar4 = strcasecmp(pcVar16,"wrap");
                    if (((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"-wrap"), iVar4 == 0)) ||
                       (iVar4 = strcasecmp(pcVar16,"w"), iVar4 == 0)) {
                      if (argc != 2) {
                        _acclvl = (TidyIterator)((ulong)_acclvl & 0xffffffff00000000);
                        iVar4 = __isoc99_sscanf(argv[2],"%u",&acclvl);
                        TVar6 = TidyWrapLen;
LAB_00130fb7:
                        tidyOptSetInt(tdoc,TVar6,(ulong)acclvl);
                        if (0 < iVar4) {
                          local_a8 = ppcVar21;
                        }
                        uVar3 = argc - (uint)(0 < iVar4);
                        goto LAB_00130db0;
                      }
                    }
                    else {
                      iVar4 = strcasecmp(pcVar16,"version");
                      if (((iVar4 == 0) || (iVar4 = strcasecmp(pcVar16,"-version"), iVar4 == 0)) ||
                         (iVar4 = strcasecmp(pcVar16,"v"), iVar4 == 0)) {
                        ptVar10 = tidyPlatform();
                        if (ptVar10 == (ctmbstr)0x0) {
                          ptVar10 = tidyLocalizedString(0x352);
                          ptVar14 = tidyLibraryVersion();
                          printf(ptVar10,ptVar14);
                        }
                        else {
                          ptVar10 = tidyLocalizedString(0x351);
                          ptVar14 = tidyPlatform();
                          ptVar20 = tidyLibraryVersion();
                          printf(ptVar10,ptVar14,ptVar20);
                        }
                        putchar(10);
                        goto LAB_00131b35;
                      }
                      if (cVar27 == '-') {
                        BVar2 = tidyOptParseValue(tdoc,pcVar12 + 2,argv[2]);
                        if (BVar2 == no) goto LAB_00130db0;
                        goto LAB_00130f0e;
                      }
                      iVar4 = strcasecmp(pcVar16,"access");
                      if (iVar4 != 0) {
                        ptVar10 = pcVar12 + 2;
                        do {
                          pFVar1 = errout;
                          switch(cVar27) {
                          case 'b':
                            TVar6 = TidyMakeBare;
                            break;
                          case 'c':
                            TVar6 = TidyMakeClean;
                            break;
                          case 'd':
                          case 'f':
                          case 'h':
                          case 'j':
                          case 'k':
                          case 'l':
                          case 'o':
                          case 'p':
                          case 'r':
                          case 's':
                          case 't':
                            goto switchD_00131017_caseD_64;
                          case 'e':
                            TVar6 = TidyShowMarkup;
                            BVar2 = no;
                            goto LAB_00131081;
                          case 'g':
                            TVar6 = TidyGDocClean;
                            break;
                          case 'i':
                            tidyOptSetInt(tdoc,TidyIndentContent,2);
                            uVar13 = tidyOptGetInt(tdoc,TidyIndentSpaces);
                            if (uVar13 == 0) {
                              tidyOptResetToDefault(tdoc,TidyIndentSpaces);
                            }
                            goto LAB_00131086;
                          case 'm':
                            TVar6 = TidyWriteBack;
                            break;
                          case 'n':
                            TVar6 = TidyNumEntities;
                            break;
                          case 'q':
                            TVar6 = TidyQuiet;
                            break;
                          case 'u':
                            TVar6 = TidyUpperCaseTags;
                            break;
                          default:
                            if (cVar27 != '\0') {
switchD_00131017_caseD_64:
                              ptVar14 = tidyLocalizedString(0x34f);
                              fprintf((FILE *)pFVar1,ptVar14,(ulong)(uint)(int)cVar27);
                              fputc(10,(FILE *)errout);
                              goto LAB_00131086;
                            }
                            goto LAB_00130db0;
                          }
                          BVar2 = yes;
LAB_00131081:
                          tidyOptSetBool(tdoc,TVar6,BVar2);
LAB_00131086:
                          cVar27 = *ptVar10;
                          ptVar10 = ptVar10 + 1;
                        } while( true );
                      }
                      if (argc != 2) {
                        _acclvl = (TidyIterator)((ulong)_acclvl & 0xffffffff00000000);
                        iVar4 = __isoc99_sscanf(argv[2],"%u",&acclvl);
                        TVar6 = TidyAccessibilityCheckLevel;
                        goto LAB_00130fb7;
                      }
                    }
LAB_00130e67:
                    uVar3 = 2;
                    local_a8 = argv;
                    goto LAB_00130db0;
                  }
                  uVar3 = 2;
                  local_a8 = argv;
                  if (argc == 2) goto LAB_00130db0;
                  local_a0 = argv[2];
                  errout = tidySetErrorFile(tdoc,local_a0);
                }
              }
LAB_00130f78:
              uVar3 = argc - 1;
              local_a8 = ppcVar21;
              goto LAB_00130db0;
            }
            ptVar10 = tidyGetLanguage();
            if ((*ptVar10 == 'e') && (ptVar10[1] == 'n')) {
              bVar30 = ptVar10[2] == '\0';
            }
            else {
              bVar30 = false;
            }
            ptVar10 = tidyLibraryVersion();
            printf("<?xml version=\"1.0\"?>\n<localized_strings version=\"%s\">\n",ptVar10);
            _acclvl = getStringKeyList();
            while (_acclvl != (TidyIterator)0x0) {
              uVar5 = getNextStringKey((TidyIterator *)&acclvl);
              ptVar10 = tidyErrorCodeAsKey(uVar5);
              iVar24 = strcmp(ptVar10,"UNDEFINED");
              if (iVar24 == 0) {
                ptVar10 = "";
              }
              printf("<localized_string id=\"%u\" label=\"%s\">\n",(ulong)uVar5,ptVar10);
              printf(" <string class=\"%s\">","en");
              ptVar10 = tidyDefaultString(uVar5);
              printf(anon_var_dwarf_19f52 + 0x16,ptVar10);
              puts("</string>");
              if (!bVar30) {
                ptVar10 = tidyLocalizedString(uVar5);
                ptVar14 = tidyDefaultString(uVar5);
                iVar24 = strcmp(ptVar10,ptVar14);
                ptVar10 = tidyGetLanguage();
                pcVar26 = "no";
                if (iVar24 == 0) {
                  pcVar26 = "yes";
                }
                printf(" <string class=\"%s\" same_as_base=\"%s\">",ptVar10,pcVar26);
                ptVar10 = tidyLocalizedString(uVar5);
                printf(anon_var_dwarf_19f52 + 0x16,ptVar10);
                puts("</string>");
              }
              puts("</localized_string>");
            }
            pcVar26 = "</localized_strings>";
          }
        }
LAB_00131b30:
        puts(pcVar26);
LAB_00131b35:
        tidyRelease(tdoc);
        return 0;
      }
      TVar6 = TidyQuiet;
      goto LAB_00130da4;
    }
    TVar6 = TidyShowMarkup;
    BVar2 = no;
  }
  tidyOptSetBool(tdoc,TVar6,BVar2);
LAB_00130db0:
  argc = uVar3 - 1;
  argv = local_a8 + 1;
  goto LAB_0013063a;
LAB_00131c12:
  iVar8 = 3;
  if (cVar27 != '&') {
    if (cVar27 == '>') {
LAB_00131c2e:
      iVar8 = 2;
    }
    else if (cVar27 != '<') {
      if (cVar27 == ';') goto LAB_00131c2e;
      iVar8 = 4;
    }
  }
  lVar23 = 0xc;
  while( true ) {
    if (lVar23 == 0xec) goto switchD_00131c7b_caseD_0;
    if ((*(int *)("%-27.27s %-9.9s  %-40.40s\n" + lVar23 + 0x14) == iVar29) &&
       (*(int *)("%-27.27s %-9.9s  %-40.40s\n" + lVar23 + 0x18) == iVar8)) break;
    lVar23 = lVar23 + 0x10;
  }
  iVar29 = *(int *)((long)&DAT_00153150 + lVar23);
  if (6 < *(uint *)(&UNK_0015314c + lVar23)) goto switchD_00131c7b_caseD_2;
  switch(*(uint *)(&UNK_0015314c + lVar23)) {
  case 0:
    goto switchD_00131c7b_caseD_0;
  case 1:
    if (pcVar11 == (char *)0x0) {
      pcVar11 = (char *)calloc(10,1);
      iVar24 = 10;
    }
    if (iVar24 <= local_98) {
      iVar24 = iVar24 + 10;
      pcVar11 = (char *)realloc(pcVar11,(long)iVar24);
    }
    pcVar11[local_98] = cVar27;
    local_98 = local_98 + 1;
  case 2:
switchD_00131c7b_caseD_2:
    iVar4 = iVar4 + 1;
    goto switchD_00131c7b_caseD_0;
  case 3:
    local_a0 = (char *)0x0;
    goto switchD_00131c7b_caseD_0;
  case 4:
    pcVar11[local_98] = '\0';
    local_a0 = "";
    for (lVar23 = 8; lVar23 != 0x98; lVar23 = lVar23 + 0x10) {
      iVar8 = strcmp(*(char **)((long)&cmdopt_catname[4].key + lVar23),pcVar11);
      if (iVar8 == 0) {
        local_a0 = *(ctmbstr *)((long)&cleanup_description_replacements + lVar23);
      }
    }
    local_98 = 0;
switchD_00131c7b_caseD_0:
    cVar27 = ptVar10[iVar4];
    if (cVar27 == '\0') goto LAB_00131dfa;
    break;
  case 5:
    iVar8 = 1;
    if (local_a0 != (char *)0x0) {
      sVar15 = strlen(local_a0);
      iVar8 = (int)sVar15;
    }
    if (local_a8 == (char **)0x0) {
      iVar9 = iVar8 + 100;
      local_a8 = (char **)calloc((long)iVar9,1);
    }
    local_3c = (int)local_48 + iVar8;
    if (iVar9 <= (int)local_3c) {
      iVar9 = iVar9 + iVar8 + 100;
      local_a8 = (char **)realloc(local_a8,(long)iVar9);
    }
    if (local_a0 == (char *)0x0) {
      *(char *)((long)local_a8 + (long)(int)local_48) = cVar27;
      *(tmbchar *)((long)local_a8 + (long)(int)local_48 + 1) = '\0';
    }
    else {
      strncpy((char *)((long)local_a8 + (long)(int)local_48),local_a0,(long)iVar8);
    }
    iVar4 = iVar4 + 1;
    local_48 = (ulong)local_3c;
    goto switchD_00131c7b_caseD_0;
  case 6:
    goto switchD_00131c7b_caseD_6;
  }
  goto LAB_00131c12;
}

Assistant:

int main( int argc, char** argv )
{
    ctmbstr prog = argv[0];
    ctmbstr cfgfil = NULL, errfil = NULL, htmlfil = NULL;
    TidyDoc tdoc = NULL;
    int status = 0;

    uint contentErrors = 0;
    uint contentWarnings = 0;
    uint accessWarnings = 0;

#if defined(ENABLE_DEBUG_LOG) && defined(_MSC_VER)
#  if defined(_CRTDBG_MAP_ALLOC)
    _CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF);
#  endif
#endif

    tdoc = tidyCreate();

    tidySetMessageCallback( tdoc, reportCallback); /* experimental group */
    errout = stderr;  /* initialize to stderr */

    /* Set an atexit handler. */
    atexit( tidy_cleanup );

#if defined(_WIN32)
    /* Force Windows console to use UTF, otherwise many characters will
     * be garbage. Note that East Asian languages *are* supported, but
     * only when Windows OS locale (not console only!) is set to an
     * East Asian language.
     */
    win_cp = GetConsoleOutputCP();
    SetConsoleOutputCP(CP_UTF8);
#endif

    /*
     * Look for default configuration files using any of
     * the following possibilities:
     *  - TIDY_CONFIG_FILE - from tidyplatform.h, typically /etc/tidy.conf
     *  - HTML_TIDY        - environment variable
     *  - TIDY_USER_CONFIG_FILE - from tidyplatform.h, typically ~/tidy.conf
     */

#ifdef TIDY_CONFIG_FILE
    if ( tidyFileExists( tdoc, TIDY_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_CONFIG_FILE */

    if ( (cfgfil = getenv("HTML_TIDY")) != NULL )
    {
        status = tidyLoadConfig( tdoc, cfgfil );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), cfgfil, status);
            fprintf(errout, "\n");
        }
    }
#ifdef TIDY_USER_CONFIG_FILE
    else if ( tidyFileExists( tdoc, TIDY_USER_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_USER_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_USER_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_USER_CONFIG_FILE */


    /*
     * Read command line
     */

    while ( argc > 0 )
    {
        if (argc > 1 && argv[1][0] == '-')
        {
            /* support -foo and --foo */
            ctmbstr arg = argv[1] + 1;

            if ( strcasecmp(arg, "xml") == 0)
                tidyOptSetBool( tdoc, TidyXmlTags, yes );

            else if ( strcasecmp(arg,   "asxml") == 0 ||
                     strcasecmp(arg, "asxhtml") == 0 )
            {
                tidyOptSetBool( tdoc, TidyXhtmlOut, yes );
            }
            else if ( strcasecmp(arg,   "ashtml") == 0 )
                tidyOptSetBool( tdoc, TidyHtmlOut, yes );

            else if ( strcasecmp(arg, "indent") == 0 )
            {
                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
            }
            else if ( strcasecmp(arg, "omit") == 0 )
                tidyOptSetBool( tdoc, TidyOmitOptionalTags, yes );

            else if ( strcasecmp(arg, "upper") == 0 )
                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );

            else if ( strcasecmp(arg, "clean") == 0 )
                tidyOptSetBool( tdoc, TidyMakeClean, yes );

            else if ( strcasecmp(arg, "gdoc") == 0 )
                tidyOptSetBool( tdoc, TidyGDocClean, yes );

            else if ( strcasecmp(arg, "bare") == 0 )
                tidyOptSetBool( tdoc, TidyMakeBare, yes );

            else if ( strcasecmp(arg, "raw") == 0     ||
                     strcasecmp(arg, "ascii") == 0    ||
                     strcasecmp(arg, "latin0") == 0   ||
                     strcasecmp(arg, "latin1") == 0   ||
                     strcasecmp(arg, "utf8") == 0     ||
#ifndef NO_NATIVE_ISO2022_SUPPORT
                     strcasecmp(arg, "iso2022") == 0  ||
#endif
                     strcasecmp(arg, "utf16le") == 0  ||
                     strcasecmp(arg, "utf16be") == 0  ||
                     strcasecmp(arg, "utf16") == 0    ||
                     strcasecmp(arg, "shiftjis") == 0 ||
                     strcasecmp(arg, "big5") == 0     ||
                     strcasecmp(arg, "mac") == 0      ||
                     strcasecmp(arg, "win1252") == 0  ||
                     strcasecmp(arg, "ibm858") == 0 )
            {
                tidySetCharEncoding( tdoc, arg );
            }
            else if ( strcasecmp(arg, "numeric") == 0 )
                tidyOptSetBool( tdoc, TidyNumEntities, yes );

            else if ( strcasecmp(arg, "modify") == 0 ||
                     strcasecmp(arg, "change") == 0 ||  /* obsolete */
                     strcasecmp(arg, "update") == 0 )   /* obsolete */
            {
                tidyOptSetBool( tdoc, TidyWriteBack, yes );
            }
            else if ( strcasecmp(arg, "errors") == 0 )
                tidyOptSetBool( tdoc, TidyShowMarkup, no );

            else if ( strcasecmp(arg, "quiet") == 0 )
                tidyOptSetBool( tdoc, TidyQuiet, yes );

            /* Currenly user must specify a language
             prior to anything that causes output */
            else if ( strcasecmp(arg, "language") == 0 ||
                     strcasecmp(arg,     "lang") == 0 )
                if ( argc >= 3)
                {
                    if ( strcasecmp(argv[2], "help") == 0 )
                    {
                        lang_help( tdoc );
                        exit(0);
                    }
                    if ( !tidySetLanguage( argv[2] ) )
                    {
                        printf(tidyLocalizedString(TC_STRING_LANG_NOT_FOUND),
                               argv[2], tidyGetLanguage());
                        printf("\n");
                    }
                    --argc;
                    ++argv;
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_LANG_MUST_SPECIFY));
                }

            else if ( strcasecmp(arg, "help") == 0 ||
                        strcasecmp(arg, "-help") == 0 ||
                        strcasecmp(arg,    "h") == 0 || *arg == '?' )
            {
                help( tdoc, prog );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-help") == 0)
            {
                xml_help( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-error-strings") == 0)
            {
                xml_error_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-options-strings") == 0)
            {
                xml_options_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-strings") == 0)
            {
                xml_strings( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-config") == 0 )
            {
                optionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-env") == 0 )
            {
                helpEnv( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-option") == 0 )
            {
                if ( argc >= 3)
                {
                    optionDescribe( tdoc, argv[2] );
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_MUST_SPECIFY));
                }
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-config") == 0 )
            {
                XMLoptionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "show-config") == 0 )
            {
                optionvalues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-config") == 0 )
            {
                exportOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-default-config") == 0 )
            {
                exportDefaultOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "config") == 0 )
            {
                if ( argc >= 3 )
                {
                    ctmbstr post;

                    tidyLoadConfig( tdoc, argv[2] );

                    /* Set new error output stream if setting changed */
                    post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    --argc;
                    ++argv;
                }
            }

            else if ( strcasecmp(arg, "output") == 0 ||
                        strcasecmp(arg, "-output-file") == 0 ||
                        strcasecmp(arg, "o") == 0 )
            {
                if ( argc >= 3 )
                {
                    tidyOptSetValue( tdoc, TidyOutFile, argv[2] );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "file") == 0 ||
                        strcasecmp(arg, "-file") == 0 ||
                        strcasecmp(arg,     "f") == 0 )
            {
                if ( argc >= 3 )
                {
                    errfil = argv[2];
                    errout = tidySetErrorFile( tdoc, errfil );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "wrap") == 0 ||
                        strcasecmp(arg, "-wrap") == 0 ||
                        strcasecmp(arg,     "w") == 0 )
            {
                if ( argc >= 3 )
                {
                    uint wraplen = 0;
                    int nfields = sscanf( argv[2], "%u", &wraplen );
                    tidyOptSetInt( tdoc, TidyWrapLen, wraplen );
                    if (nfields > 0)
                    {
                        --argc;
                        ++argv;
                    }
                }
            }
            else if ( strcasecmp(arg,  "version") == 0 ||
                        strcasecmp(arg, "-version") == 0 ||
                        strcasecmp(arg,        "v") == 0 )
            {
                version( tdoc );
                tidyRelease( tdoc );
                return 0;  /* success */

            }
            else if ( strncmp(argv[1], "--", 2 ) == 0)
            {
                if ( tidyOptParseValue(tdoc, argv[1]+2, argv[2]) )
                {
                    /* Set new error output stream if setting changed */
                    ctmbstr post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    ++argv;
                    --argc;
                }
            }
                else if ( strcasecmp(arg, "access") == 0 )
                {
                    if ( argc >= 3 )
                    {
                        uint acclvl = 0;
                        int nfields = sscanf( argv[2], "%u", &acclvl );
                        tidyOptSetInt( tdoc, TidyAccessibilityCheckLevel, acclvl );
                        if (nfields > 0)
                        {
                            --argc;
                            ++argv;
                        }
                    }
                }

                else
                {
                    uint c;
                    ctmbstr s = argv[1];

                    while ( (c = *++s) != '\0' )
                    {
                        switch ( c )
                        {
                            case 'i':
                                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
                                break;

                            case 'u':
                                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );
                                break;

                            case 'c':
                                tidyOptSetBool( tdoc, TidyMakeClean, yes );
                                break;

                            case 'g':
                                tidyOptSetBool( tdoc, TidyGDocClean, yes );
                                break;

                            case 'b':
                                tidyOptSetBool( tdoc, TidyMakeBare, yes );
                                break;

                            case 'n':
                                tidyOptSetBool( tdoc, TidyNumEntities, yes );
                                break;

                            case 'm':
                                tidyOptSetBool( tdoc, TidyWriteBack, yes );
                                break;

                            case 'e':
                                tidyOptSetBool( tdoc, TidyShowMarkup, no );
                                break;

                            case 'q':
                                tidyOptSetBool( tdoc, TidyQuiet, yes );
                                break;

                            default:
                                unknownOption( tdoc, c );
                                break;
                        }
                    }
                }

            --argc;
            ++argv;
            continue;
        }


        if ( argc > 1 )
        {
            htmlfil = argv[1];
#ifdef ENABLE_DEBUG_LOG
            SPRTF("Tidy: '%s'\n", htmlfil);
#else /* !ENABLE_DEBUG_LOG */
            /* Is #713 - show-filename option */
            if (tidyOptGetBool(tdoc, TidyShowFilename))
            {
                fprintf(errout, "Tidy: '%s'", htmlfil);
                fprintf(errout, "\n");
            }
#endif /* ENABLE_DEBUG_LOG yes/no */
            if ( tidyOptGetBool(tdoc, TidyEmacs) || tidyOptGetBool(tdoc, TidyShowFilename))
                tidySetEmacsFile( tdoc, htmlfil );
            status = tidyParseFile( tdoc, htmlfil );
        }
        else
        {
            htmlfil = "stdin";
            status = tidyParseStdin( tdoc );
        }

        if ( status >= 0 )
            status = tidyCleanAndRepair( tdoc );

        if ( status >= 0 ) {
            status = tidyRunDiagnostics( tdoc );
        }
        if ( status > 1 ) /* If errors, do we want to force output? */
            status = ( tidyOptGetBool(tdoc, TidyForceOutput) ? status : -1 );

        if ( status >= 0 && tidyOptGetBool(tdoc, TidyShowMarkup) )
        {
            if ( tidyOptGetBool(tdoc, TidyWriteBack) && argc > 1 )
                status = tidySaveFile( tdoc, htmlfil );
            else
            {
                ctmbstr outfil = tidyOptGetValue( tdoc, TidyOutFile );
                if ( outfil ) {
                    status = tidySaveFile( tdoc, outfil );
                } else {
#ifdef ENABLE_DEBUG_LOG
                    static char tmp_buf[264];
                    sprintf(tmp_buf,"%s.html",get_log_file());
                    status = tidySaveFile( tdoc, tmp_buf );
                    SPRTF("Saved tidied content to '%s'\n",tmp_buf);
#else
                    status = tidySaveStdout( tdoc );
#endif
                }
            }
        }
        
        contentErrors   += tidyErrorCount( tdoc );
        contentWarnings += tidyWarningCount( tdoc );
        accessWarnings  += tidyAccessWarningCount( tdoc );
        
        --argc;
        ++argv;
        
        if ( argc <= 1 )
            break;
    } /* read command line loop */

    /* blank line for screen formatting */
    if ( errout == stderr && !contentErrors && !tidyOptGetBool( tdoc, TidyQuiet ) )
        fprintf(errout, "\n");

    /* footnote printing only if errors or warnings */
    if ( contentErrors + contentWarnings > 0 )
        tidyErrorSummary(tdoc);

    /* prints the general info, if applicable */
    tidyGeneralInfo(tdoc);

    /* called to free hash tables etc. */
    tidyRelease( tdoc );
    
    /* return status can be used by scripts */
    if ( contentErrors > 0 )
        return 2;
    
    if ( contentWarnings > 0 )
        return 1;
    
    /* 0 signifies all is ok */
    return 0;
}